

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_applyScaledObj<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Rational *dualScale,SolRational *sol)

{
  pointer pnVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Rational newRowObj;
  cpp_dec_float<100U,_int,_void> local_148;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *local_f0;
  data_type local_e8;
  undefined4 local_d8;
  undefined2 local_d4;
  char local_d2;
  data_type local_c8;
  undefined4 local_b8;
  undefined2 local_b4;
  char local_b2;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *local_a0;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_98;
  SolRational *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  lVar6 = *(long *)(this + 0x5988);
  uVar5 = (ulong)*(int *)(lVar6 + 0x100);
  local_98 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)dualScale;
  local_90 = sol;
  if (0 < (long)uVar5) {
    local_f0 = this + 0x80;
    lVar6 = uVar5 << 6;
    do {
      lVar6 = lVar6 + -0x40;
      iVar3 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)(*(long *)(this + 0x6068) + lVar6),
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)(this + 0x40));
      if (iVar3 < 0) {
        iVar3 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)(*(long *)(this + 0x6068) + lVar6),
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)local_f0);
        if (iVar3 < 1) {
          uVar7 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
          uVar8 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20) ^ 0x80000000
          ;
          goto LAB_004a6826;
        }
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::detail::
        generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                  (&local_148,
                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)(*(long *)(this + 0x6068) + lVar6));
      }
      else {
        uVar7 = (undefined4)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0);
        uVar8 = (uint)((ulong)*(undefined8 *)(*(long *)(this + 0x28) + 0xc0) >> 0x20);
LAB_004a6826:
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_148,(double)CONCAT44(uVar8,uVar7));
      }
      (*(solver->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])(solver,(ulong)((int)uVar5 - 1),&local_148);
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    lVar6 = *(long *)(this + 0x5988);
  }
  uVar5 = (ulong)*(int *)(lVar6 + 0x38);
  if (0 < (long)uVar5) {
    local_f0 = this + 0x40;
    local_a0 = this + 0x80;
    lVar6 = uVar5 << 6;
    do {
      local_e8.la[0] = 0;
      local_d8 = 1;
      local_d4 = 0x100;
      local_d2 = '\0';
      local_c8.la[0] = 1;
      local_b8 = 1;
      local_b4 = 0x100;
      local_b2 = '\0';
      iVar3 = (int)uVar5;
      if (*(int *)(*(long *)(this + 0x6118) + -4 + uVar5 * 4) == 4) {
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_148,0.0);
        (*(solver->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x3c])(solver,(ulong)(iVar3 - 1),&local_148);
      }
      else {
        pnVar1 = (local_90->_dual).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_e8.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar6));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_c8.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&pnVar1[-1].m_backend.m_value.den.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar6));
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_e8.ld,local_98);
        iVar4 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_e8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)local_f0);
        if (iVar4 < 0) {
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_e8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)local_a0);
          if (iVar4 < 1) {
            local_148.fpclass = cpp_dec_float_finite;
            local_148.prec_elem = 0x10;
            local_148.data._M_elems[0] = 0;
            local_148.data._M_elems[1] = 0;
            local_148.data._M_elems[2] = 0;
            local_148.data._M_elems[3] = 0;
            local_148.data._M_elems[4] = 0;
            local_148.data._M_elems[5] = 0;
            local_148.data._M_elems[6] = 0;
            local_148.data._M_elems[7] = 0;
            local_148.data._M_elems[8] = 0;
            local_148.data._M_elems[9] = 0;
            local_148.data._M_elems[10] = 0;
            local_148.data._M_elems[0xb] = 0;
            local_148.data._M_elems[0xc] = 0;
            local_148.data._M_elems[0xd] = 0;
            local_148.data._M_elems[0xe] = 0;
            local_148.data._M_elems[0xf] = 0;
            local_148.exp = 0;
            local_148.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_148,
                       *(double *)(*(long *)(this + 0x28) + 0xc0));
            (*(solver->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x3c])(solver,(ulong)(iVar3 - 1),&local_148);
          }
          else {
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems[0xe] = 0;
            local_88.data._M_elems[0xf] = 0;
            local_88.exp = 0;
            local_88.neg = false;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      (&local_88,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_e8.ld);
            local_148.data._M_elems[0] = local_88.data._M_elems[0];
            local_148.data._M_elems[1] = local_88.data._M_elems[1];
            local_148.data._M_elems[2] = local_88.data._M_elems[2];
            local_148.data._M_elems[3] = local_88.data._M_elems[3];
            local_148.data._M_elems[0xc] = local_88.data._M_elems[0xc];
            local_148.data._M_elems[0xd] = local_88.data._M_elems[0xd];
            local_148.data._M_elems[0xe] = local_88.data._M_elems[0xe];
            local_148.data._M_elems[0xf] = local_88.data._M_elems[0xf];
            local_148.data._M_elems[8] = local_88.data._M_elems[8];
            local_148.data._M_elems[9] = local_88.data._M_elems[9];
            local_148.data._M_elems[10] = local_88.data._M_elems[10];
            local_148.data._M_elems[0xb] = local_88.data._M_elems[0xb];
            local_148.data._M_elems[4] = local_88.data._M_elems[4];
            local_148.data._M_elems[5] = local_88.data._M_elems[5];
            local_148.data._M_elems[6] = local_88.data._M_elems[6];
            local_148.data._M_elems[7] = local_88.data._M_elems[7];
            local_148.exp = local_88.exp;
            local_148.neg = local_88.neg;
            local_148.fpclass = local_88.fpclass;
            local_148.prec_elem = local_88.prec_elem;
            if (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0) {
              local_148.neg = (bool)(local_88.neg ^ 1);
            }
            (*(solver->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x3c])(solver,(ulong)(iVar3 - 1),&local_148);
          }
        }
        else {
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x10;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems[0xe] = 0;
          local_148.data._M_elems[0xf] = 0;
          local_148.exp = 0;
          local_148.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_148,
                     -*(double *)(*(long *)(this + 0x28) + 0xc0));
          (*(solver->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x3c])(solver,(ulong)(iVar3 - 1),&local_148);
        }
      }
      if ((local_b4._1_1_ == '\0') && (local_b2 == '\0')) {
        operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_d4._1_1_ == '\0') && (local_d2 == '\0')) {
        operator_delete(local_e8.ld.data,(local_e8.la[0] & 0xffffffff) << 3);
      }
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
      lVar6 = lVar6 + -0x40;
    } while (bVar2);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledObj(SPxSolverBase<T>& solver, Rational& dualScale, SolRational& sol)
{
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_modObj[c] >= _rationalPosInfty)
         solver.changeObj(c, realParam(SoPlexBase<R>::INFTY));
      else if(_modObj[c] <= _rationalNegInfty)
         solver.changeObj(c, -realParam(SoPlexBase<R>::INFTY));
      else
         solver.changeObj(c, T(_modObj[c]));
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      Rational newRowObj;

      if(_rowTypes[r] == RANGETYPE_FIXED)
         solver.changeRowObj(r, T(0.0));
      else
      {
         newRowObj = sol._dual[r];
         newRowObj *= dualScale;

         if(newRowObj >= _rationalPosInfty)
            solver.changeRowObj(r, -realParam(SoPlexBase<R>::INFTY));
         else if(newRowObj <= _rationalNegInfty)
            solver.changeRowObj(r, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeRowObj(r, -T(newRowObj));
      }
   }
}